

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::begin__common_float_or_param_type____float
          (LibraryEffectsLoader *this,
          common_float_or_param_type____float__AttributeData *attributeData)

{
  CommonEffectPointerArray *pCVar1;
  EffectCommon **ppEVar2;
  undefined8 *in_RSI;
  IFilePartLoader *in_RDI;
  Animatable *in_stack_ffffffffffffffc8;
  Animatable *target;
  char *in_stack_ffffffffffffffd0;
  char *pcVar3;
  char *in_stack_ffffffffffffffd8;
  
  switch(*(undefined4 *)&in_RDI[0x10].mPartLoader) {
  case 4:
    pcVar3 = (char *)*in_RSI;
    pCVar1 = COLLADAFW::Effect::getCommonEffects((Effect *)in_RDI[1].mParserImpl);
    ppEVar2 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::EffectCommon_*>::back
                        (&pCVar1->super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>);
    COLLADAFW::EffectCommon::getShininess(*ppEVar2);
    IFilePartLoader::addToSidTree(in_RDI,pcVar3,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
    ;
    break;
  default:
    break;
  case 6:
    pcVar3 = (char *)*in_RSI;
    pCVar1 = COLLADAFW::Effect::getCommonEffects((Effect *)in_RDI[1].mParserImpl);
    ppEVar2 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::EffectCommon_*>::back
                        (&pCVar1->super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>);
    COLLADAFW::EffectCommon::getReflectivity(*ppEVar2);
    IFilePartLoader::addToSidTree(in_RDI,in_stack_ffffffffffffffd8,pcVar3,in_stack_ffffffffffffffc8)
    ;
    break;
  case 8:
    IFilePartLoader::addToSidTree
              (in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
    ;
    break;
  case 9:
    target = (Animatable *)*in_RSI;
    pCVar1 = COLLADAFW::Effect::getCommonEffects((Effect *)in_RDI[1].mParserImpl);
    ppEVar2 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::EffectCommon_*>::back
                        (&pCVar1->super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>);
    COLLADAFW::EffectCommon::getIndexOfRefraction(*ppEVar2);
    IFilePartLoader::addToSidTree(in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,target)
    ;
  }
  return true;
}

Assistant:

bool LibraryEffectsLoader::begin__common_float_or_param_type____float ( const common_float_or_param_type____float__AttributeData& attributeData )
    {
        switch ( mCurrentShaderParameterType)
        {
        case SHADER_PARAMETER_SHININESS:
            addToSidTree( 0, attributeData.sid, &mCurrentEffect->getCommonEffects().back()->getShininess() );
            break;
        case SHADER_PARAMETER_REFLECTIVITY:
            addToSidTree( 0, attributeData.sid, &mCurrentEffect->getCommonEffects().back()->getReflectivity() );
            break;
        case SHADER_PARAMETER_INDEX_OF_REFRACTION:
            addToSidTree( 0, attributeData.sid, &mCurrentEffect->getCommonEffects().back()->getIndexOfRefraction() );
            break;
        case SHADER_PARAMETER_TRANSPARENCY:
            addToSidTree( 0, attributeData.sid, &mTransparency );
            break;
        default:
            break;
        }      
        return true;
    }